

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O1

Move __thiscall search::PVTable::getMove(PVTable *this,Board *pos)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  Move MVar4;
  __hash_code __code;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  p_Var3 = (_Hash_node_base *)pos->hashKey;
  uVar1 = (this->map)._M_h._M_bucket_count;
  uVar5 = (ulong)p_Var3 % uVar1;
  p_Var6 = (this->map)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var3 != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var3 == p_Var2[1]._M_nxt)) goto LAB_00108448;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00108448:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    MVar4.value = 0;
    MVar4.score = 0;
    return MVar4;
  }
  return *(Move *)(p_Var3 + 2);
}

Assistant:

inline uint64_t Board::getHashKey() const
{
    return hashKey;
}